

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

void fiobj_free_complex_object(FIOBJ o)

{
  undefined1 uVar1;
  fiobj_object_vtable_s *pfVar2;
  fiobj_stack_s stack;
  long local_58;
  long lStack_50;
  undefined8 local_48;
  void *pvStack_40;
  
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_58 = 0;
  lStack_50 = 0;
  while( true ) {
    if (o == 0) {
      uVar1 = 6;
    }
    else {
      uVar1 = 1;
      if ((o & 1) == 0) {
        switch((uint)o & 6) {
        case 0:
          uVar1 = *(undefined1 *)(o & 0xfffffffffffffff8);
          break;
        case 2:
          uVar1 = 0x28;
          break;
        case 4:
          uVar1 = 0x2a;
          break;
        case 6:
          uVar1 = (undefined1)o;
        }
      }
    }
    pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    switch(uVar1) {
    case 0x27:
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar2 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar2 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar2 = &FIOBJECT_VTABLE_DATA;
    }
    (*pfVar2->dealloc)(o,fiobj_dealloc_task,&local_58);
    if (lStack_50 == local_58) break;
    o = *(ulong *)((long)pvStack_40 + lStack_50 * 8 + -8);
    lStack_50 = lStack_50 + -1;
  }
  fio_free(pvStack_40);
  return;
}

Assistant:

void fiobj_free_complex_object(FIOBJ o) {
  fiobj_stack_s stack = FIO_ARY_INIT;
  do {
    FIOBJECT2VTBL(o)->dealloc(o, fiobj_dealloc_task, &stack);
  } while (!fiobj_stack_pop(&stack, &o));
  fiobj_stack_free(&stack);
}